

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dxil_buffer.cpp
# Opt level: O3

uint dxil_spv::emit_buffer_store_values_bitcast
               (Impl *impl,CallInst *instruction,Id *store_values,uint write_mask,RawWidth raw_width
               ,bool is_typed,bool ignore_bitcast)

{
  bool bVar1;
  Id IVar2;
  TypeID TVar3;
  Value *pVVar4;
  Type *data_type;
  Builder *this;
  ulong uVar5;
  Operation *pOVar6;
  long lVar7;
  uint index;
  int width;
  Op op;
  
  pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,4);
  data_type = LLVMBC::Value::getType(pVVar4);
  this = Converter::Impl::builder(impl);
  lVar7 = 0;
  uVar5 = 0;
  do {
    if ((write_mask >> ((uint)lVar7 & 0x1f) & 1) != 0) {
      index = (uint)lVar7 | 4;
      pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,index);
      Converter::Impl::register_externally_visible_write(impl,pVVar4);
      pVVar4 = LLVMBC::Instruction::getOperand(&instruction->super_Instruction,index);
      IVar2 = Converter::Impl::get_id_for_value(impl,pVVar4,0);
      store_values[lVar7] = IVar2;
      if (!is_typed) {
        if ((((impl->execution_mode_meta).native_16bit_operations == false) &&
            ((impl->options).min_precision_prefer_native_16bit == true)) &&
           (bVar1 = type_is_16bit(data_type), bVar1)) {
          TVar3 = LLVMBC::Type::getTypeID(data_type);
          if (TVar3 == HalfTyID) {
            IVar2 = spv::Builder::makeFloatType(this,0x20);
            pOVar6 = Converter::Impl::allocate(impl,OpFConvert,IVar2);
            Operation::add_id(pOVar6,store_values[lVar7]);
            store_values[lVar7] = pOVar6->id;
            Converter::Impl::add(impl,pOVar6,false);
            if (!ignore_bitcast) {
              IVar2 = spv::Builder::makeIntegerType(this,0x20,false);
              pOVar6 = Converter::Impl::allocate(impl,OpBitcast,IVar2);
              Operation::add_id(pOVar6,store_values[lVar7]);
              Converter::Impl::add(impl,pOVar6,false);
              store_values[lVar7] = pOVar6->id;
            }
          }
          else {
            IVar2 = spv::Builder::makeIntegerType(this,0x20,false);
            op = OpUConvert;
LAB_0017596f:
            pOVar6 = Converter::Impl::allocate(impl,op,IVar2);
            Operation::add_id(pOVar6,store_values[lVar7]);
            store_values[lVar7] = pOVar6->id;
            Converter::Impl::add(impl,pOVar6,false);
          }
        }
        else if (((!ignore_bitcast) &&
                 (TVar3 = LLVMBC::Type::getTypeID(data_type), TVar3 != DoubleTyID)) &&
                (TVar3 = LLVMBC::Type::getTypeID(data_type), TVar3 != IntegerTyID)) {
          width = 0x20;
          if (raw_width < Count) {
            width = *(int *)(&DAT_001c2c20 + (ulong)raw_width * 4);
          }
          IVar2 = spv::Builder::makeIntegerType(this,width,false);
          op = OpBitcast;
          goto LAB_0017596f;
        }
      }
      uVar5 = lVar7 + 1U & 0xffffffff;
    }
    lVar7 = lVar7 + 1;
    if (lVar7 == 4) {
      return (uint)uVar5;
    }
  } while( true );
}

Assistant:

static unsigned emit_buffer_store_values_bitcast(Converter::Impl &impl, const llvm::CallInst *instruction,
                                                 spv::Id *store_values, unsigned write_mask,
                                                 RawWidth raw_width,
                                                 bool is_typed, bool ignore_bitcast)
{
	auto *element_type = instruction->getOperand(4)->getType();
	auto &builder = impl.builder();
	unsigned raw_vecsize = 0;

	for (unsigned i = 0; i < 4; i++)
	{
		if ((write_mask & (1u << i)) != 0)
		{
			impl.register_externally_visible_write(instruction->getOperand(4 + i));
			store_values[i] = impl.get_id_for_value(instruction->getOperand(4 + i));
			if (!is_typed)
			{
				// If we're storing to min16 types and we use native 16-bit in arithmetic,
				// we have to expand to 32-bit before storing :(
				// This will probably fall over with int vs uint, since we don't know how to sign-extend.
				if (!impl.execution_mode_meta.native_16bit_operations &&
				    impl.options.min_precision_prefer_native_16bit &&
				    type_is_16bit(element_type))
				{
					if (element_type->getTypeID() == llvm::Type::TypeID::HalfTyID)
					{
						Operation *op = impl.allocate(spv::OpFConvert, builder.makeFloatType(32));
						op->add_id(store_values[i]);
						store_values[i] = op->id;
						impl.add(op);

						if (!ignore_bitcast)
						{
							Operation *bitcast_op = impl.allocate(spv::OpBitcast, builder.makeUintType(32));
							bitcast_op->add_id(store_values[i]);
							impl.add(bitcast_op);
							store_values[i] = bitcast_op->id;
						}
					}
					else
					{
						// SConvert or UConvert, who knows. :)
						Operation *op = impl.allocate(spv::OpUConvert, builder.makeUintType(32));
						op->add_id(store_values[i]);
						store_values[i] = op->id;
						impl.add(op);
					}
				}
				else if (!ignore_bitcast &&
				         element_type->getTypeID() != llvm::Type::TypeID::DoubleTyID &&
				         element_type->getTypeID() != llvm::Type::TypeID::IntegerTyID)
				{
					Operation *op = impl.allocate(spv::OpBitcast, builder.makeUintType(raw_width_to_bits(raw_width)));
					op->add_id(store_values[i]);
					store_values[i] = op->id;
					impl.add(op);
				}
			}

			raw_vecsize = i + 1;
		}
	}

	return raw_vecsize;
}